

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::SetPackageName(CommandLineArguments *this,int ac,char **av,int *i)

{
  size_t sVar1;
  int ac_00;
  SimpleString packageName;
  undefined1 auStack_38 [16];
  
  ac_00 = 0x1b19f7;
  SimpleString::SimpleString((SimpleString *)(auStack_38 + 8),"-k");
  getParameterField((CommandLineArguments *)auStack_38,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString((SimpleString *)(auStack_38 + 8));
  sVar1 = SimpleString::size((SimpleString *)auStack_38);
  if (sVar1 != 0) {
    SimpleString::operator=(&this->packageName_,(SimpleString *)auStack_38);
  }
  SimpleString::~SimpleString((SimpleString *)auStack_38);
  return;
}

Assistant:

void CommandLineArguments::SetPackageName(int ac, const char** av, int& i)
{
    SimpleString packageName = getParameterField(ac, av, i, "-k");
    if (packageName.size() == 0) return;

    packageName_ = packageName;
}